

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeChecker.cpp
# Opt level: O0

Action __thiscall
psy::C::TypeChecker::visitBinaryExpression_BitwiseShift<psy::C::AssignmentExpressionSyntax>
          (TypeChecker *this,AssignmentExpressionSyntax *node,Type *leftTy,Type *rightTy)

{
  bool bVar1;
  BasicTypeKind BVar2;
  int iVar3;
  ExpressionSyntax *pEVar4;
  undefined4 extraout_var;
  Compilation *this_00;
  Type *pTVar5;
  BasicTypeKind promoTyK;
  Type *rightTy_local;
  Type *leftTy_local;
  AssignmentExpressionSyntax *node_local;
  TypeChecker *this_local;
  
  pEVar4 = AssignmentExpressionSyntax::left(node);
  bVar1 = satisfyIntegerTypeConstraint(this,leftTy,&pEVar4->super_SyntaxNode);
  if (bVar1) {
    pEVar4 = AssignmentExpressionSyntax::right(node);
    bVar1 = satisfyIntegerTypeConstraint(this,rightTy,&pEVar4->super_SyntaxNode);
    if (bVar1) {
      iVar3 = (*leftTy->_vptr_Type[5])();
      BVar2 = BasicType::kind((BasicType *)CONCAT44(extraout_var,iVar3));
      BVar2 = performIntegerPromotion(BVar2);
      this_00 = SemanticModel::compilation(this->semaModel_);
      pTVar5 = &Compilation::canonicalBasicType(this_00,BVar2)->super_Type;
      this->ty_ = pTVar5;
      return Skip;
    }
  }
  return Quit;
}

Assistant:

SyntaxVisitor::Action TypeChecker::visitBinaryExpression_BitwiseShift(
        const BinaryLikeExprNodeT* node,
        const Type* leftTy,
        const Type* rightTy)
{
    if (!(satisfyIntegerTypeConstraint(leftTy, node->left())
            && satisfyIntegerTypeConstraint(rightTy, node->right()))) {
        return Action::Quit;
    }
    auto promoTyK = performIntegerPromotion(leftTy->asBasicType()->kind());
    ty_ = semaModel_->compilation()->canonicalBasicType(promoTyK);

    return Action::Skip;
}